

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O0

void __thiscall fmt::File::File(File *this,CStringRef path,int oflag)

{
  CStringRef arg1;
  int iVar1;
  char *__file;
  int *piVar2;
  undefined8 uVar3;
  int in_EDX;
  int *in_RDI;
  bool bVar4;
  BasicCStringRef<char> *in_stack_00000018;
  int in_stack_00000024;
  SystemError *in_stack_00000028;
  int mode;
  BasicCStringRef<char> local_20;
  uint local_18;
  int local_14;
  BasicCStringRef<char> local_8;
  
  local_18 = 0x180;
  local_14 = in_EDX;
  do {
    __file = BasicCStringRef<char>::c_str(&local_8);
    iVar1 = open(__file,local_14,(ulong)local_18);
    *in_RDI = iVar1;
    bVar4 = false;
    if (*in_RDI == -1) {
      piVar2 = __errno_location();
      bVar4 = *piVar2 == 4;
    }
  } while (bVar4);
  if (*in_RDI == -1) {
    uVar3 = __cxa_allocate_exception(0x18);
    __errno_location();
    BasicCStringRef<char>::BasicCStringRef(&local_20,"cannot open file {}");
    arg1.data_._4_4_ = oflag;
    arg1.data_._0_4_ = mode;
    SystemError::SystemError<fmt::BasicCStringRef<char>>
              (in_stack_00000028,in_stack_00000024,arg1,in_stack_00000018);
    __cxa_throw(uVar3,&SystemError::typeinfo,SystemError::~SystemError);
  }
  return;
}

Assistant:

fmt::File::File(fmt::CStringRef path, int oflag) {
  int mode = S_IRUSR | S_IWUSR;
#if defined(_WIN32) && !defined(__MINGW32__)
  fd_ = -1;
  FMT_POSIX_CALL(sopen_s(&fd_, path.c_str(), oflag, _SH_DENYNO, mode));
#else
  FMT_RETRY(fd_, FMT_POSIX_CALL(open(path.c_str(), oflag, mode)));
#endif
  if (fd_ == -1)
    FMT_THROW(SystemError(errno, "cannot open file {}", path));
}